

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O1

void helicsFederateSetQueryCallback
               (HelicsFederate fed,_func_void_char_ptr_int_HelicsQueryBuffer_void_ptr *queryAnswer,
               void *userdata,HelicsError *err)

{
  Federate *this;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (queryAnswer == (_func_void_char_ptr_int_HelicsQueryBuffer_void_ptr *)0x0) {
      local_28 = (code *)0x0;
      pcStack_20 = (code *)0x0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      helics::Federate::setQueryCallback
                (this,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
    else {
      pcStack_20 = std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:112:38)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:112:38)>
                 ::_M_manager;
      local_38._M_unused._0_8_ = (undefined8)queryAnswer;
      local_38._8_8_ = userdata;
      helics::Federate::setQueryCallback
                (this,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateSetQueryCallback(HelicsFederate fed,
                                    void (*queryAnswer)(const char* query, int querySize, HelicsQueryBuffer buffer, void* userdata),
                                    void* userdata,
                                    HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (queryAnswer == nullptr) {
            fedptr->setQueryCallback({});
        } else {
            fedptr->setQueryCallback([queryAnswer, userdata](std::string_view query) {
                std::string buffer(1, '>');
                queryAnswer(query.data(), static_cast<int>(query.size()), &buffer, userdata);
                buffer.pop_back();
                return buffer;
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}